

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

int __thiscall HighsMipSolverData::init(HighsMipSolverData *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  HighsPostsolveStack *unaff_retaddr;
  HighsCliqueTable *in_stack_000002a0;
  HighsLp *in_stack_000002a8;
  HighsCliqueTable *in_stack_000002b0;
  HighsInt local_2c;
  HighsCDouble local_18;
  HighsMipSolverData *init;
  
  init = this;
  presolve::HighsPostsolveStack::initializeIndexMaps
            (unaff_retaddr,(HighsInt)((ulong)this >> 0x20),(int)this);
  this->mipsolver->orig_model_ = this->mipsolver->model_;
  this->feastol =
       (this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance;
  this->epsilon = (this->mipsolver->options_mip_->super_HighsOptionsStruct).small_matrix_value;
  if (this->mipsolver->clqtableinit != (HighsCliqueTable *)0x0) {
    HighsCliqueTable::buildFrom(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0);
  }
  iVar1 = ::highs::parallel::num_threads();
  if (iVar1 < 2) {
    local_2c = 0x7fffffff;
  }
  else {
    local_2c = (this->mipsolver->options_mip_->super_HighsOptionsStruct).
               mip_min_cliquetable_entries_for_parallelism;
  }
  HighsCliqueTable::setMinEntriesForParallelism(&this->cliquetable,local_2c);
  if (this->mipsolver->implicinit != (HighsImplications *)0x0) {
    HighsImplications::buildFrom((HighsImplications *)unaff_retaddr,(HighsImplications *)init);
  }
  this->heuristic_effort =
       (this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_heuristic_effort;
  this->detectSymmetries =
       (bool)((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_detect_symmetry & 1);
  this->firstlpsolobj = -INFINITY;
  this->rootlpsolobj = -INFINITY;
  this->analyticCenterComputed = false;
  this->analyticCenterStatus = kMin;
  this->maxTreeSizeLog2 = 0;
  this->numRestarts = 0;
  this->numRestartsRoot = 0;
  this->numImprovingSols = 0;
  HighsCDouble::HighsCDouble(&local_18,0.0);
  (this->pruned_treeweight).hi = local_18.hi;
  (this->pruned_treeweight).lo = local_18.lo;
  this->avgrootlpiters = 0.0;
  this->num_nodes = 0;
  this->num_nodes_before_run = 0;
  this->num_leaves = 0;
  this->num_leaves_before_run = 0;
  this->total_repair_lp = 0;
  this->total_repair_lp_feasible = 0;
  this->total_repair_lp_iterations = 0;
  this->total_lp_iterations = 0;
  this->heuristic_lp_iterations = 0;
  this->sepa_lp_iterations = 0;
  this->sb_lp_iterations = 0;
  this->total_lp_iterations_before_run = 0;
  this->heuristic_lp_iterations_before_run = 0;
  this->sepa_lp_iterations_before_run = 0;
  this->sb_lp_iterations_before_run = 0;
  this->num_disp_lines = 0;
  this->numCliqueEntriesAfterPresolve = 0;
  this->numCliqueEntriesAfterFirstPresolve = 0;
  this->cliquesExtracted = false;
  this->rowMatrixSet = false;
  this->lower_bound = -INFINITY;
  this->upper_bound = INFINITY;
  this->upper_limit = (this->mipsolver->options_mip_->super_HighsOptionsStruct).objective_bound;
  this->optimality_limit = (this->mipsolver->options_mip_->super_HighsOptionsStruct).objective_bound
  ;
  HighsPrimaDualIntegral::initialise(&this->primal_dual_integral);
  if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_report_level == 0) {
    this->dispfreq = 0;
  }
  else if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_report_level == 1) {
    this->dispfreq = 2000;
  }
  else {
    this->dispfreq = 100;
  }
  return (int)this;
}

Assistant:

void HighsMipSolverData::init() {
  postSolveStack.initializeIndexMaps(mipsolver.model_->num_row_,
                                     mipsolver.model_->num_col_);
  mipsolver.orig_model_ = mipsolver.model_;
  feastol = mipsolver.options_mip_->mip_feasibility_tolerance;
  epsilon = mipsolver.options_mip_->small_matrix_value;
  if (mipsolver.clqtableinit)
    cliquetable.buildFrom(mipsolver.orig_model_, *mipsolver.clqtableinit);
  cliquetable.setMinEntriesForParallelism(
      highs::parallel::num_threads() > 1
          ? mipsolver.options_mip_->mip_min_cliquetable_entries_for_parallelism
          : kHighsIInf);
  if (mipsolver.implicinit) implications.buildFrom(*mipsolver.implicinit);
  heuristic_effort = mipsolver.options_mip_->mip_heuristic_effort;
  detectSymmetries = mipsolver.options_mip_->mip_detect_symmetry;

  firstlpsolobj = -kHighsInf;
  rootlpsolobj = -kHighsInf;
  analyticCenterComputed = false;
  analyticCenterStatus = HighsModelStatus::kNotset;
  maxTreeSizeLog2 = 0;
  numRestarts = 0;
  numRestartsRoot = 0;
  numImprovingSols = 0;
  pruned_treeweight = 0;
  avgrootlpiters = 0;
  num_nodes = 0;
  num_nodes_before_run = 0;
  num_leaves = 0;
  num_leaves_before_run = 0;
  total_repair_lp = 0;
  total_repair_lp_feasible = 0;
  total_repair_lp_iterations = 0;
  total_lp_iterations = 0;
  heuristic_lp_iterations = 0;
  sepa_lp_iterations = 0;
  sb_lp_iterations = 0;
  total_lp_iterations_before_run = 0;
  heuristic_lp_iterations_before_run = 0;
  sepa_lp_iterations_before_run = 0;
  sb_lp_iterations_before_run = 0;
  num_disp_lines = 0;
  numCliqueEntriesAfterPresolve = 0;
  numCliqueEntriesAfterFirstPresolve = 0;
  cliquesExtracted = false;
  rowMatrixSet = false;
  lower_bound = -kHighsInf;
  upper_bound = kHighsInf;
  upper_limit = mipsolver.options_mip_->objective_bound;
  optimality_limit = mipsolver.options_mip_->objective_bound;
  primal_dual_integral.initialise();

  if (mipsolver.options_mip_->mip_report_level == 0)
    dispfreq = 0;
  else if (mipsolver.options_mip_->mip_report_level == 1)
    dispfreq = 2000;
  else
    dispfreq = 100;
}